

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void operator_bool_suite::test_real(void)

{
  longdouble in_ST0;
  float value;
  double value_00;
  undefined1 local_249;
  basic_variable<std::allocator<char>_> local_248;
  undefined1 local_20b [2];
  undefined1 local_209;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  undefined1 local_18b [2];
  undefined1 local_189;
  basic_variable<std::allocator<char>_> local_188;
  undefined1 local_14b [2];
  undefined1 local_149;
  basic_variable<std::allocator<char>_> local_148;
  undefined1 local_10b [2];
  undefined1 local_109;
  basic_variable<std::allocator<char>_> local_108;
  undefined1 local_cb [2];
  undefined1 local_c9;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_8b [2];
  undefined1 local_89;
  basic_variable<std::allocator<char>_> local_88;
  undefined1 local_57 [2];
  undefined1 local_55 [13];
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_48,0.0);
  local_a[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_48);
  local_55[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(0.0f))","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20ec,"void operator_bool_suite::test_real()",local_a,local_55);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_88,1.0);
  local_57[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_88);
  local_89 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(1.0f))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20ed,"void operator_bool_suite::test_real()",local_57,&local_89);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_88);
  value = std::numeric_limits<float>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_c8,value);
  local_8b[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_c8);
  local_c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(std::numeric_limits<float>::max()))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20ee,"void operator_bool_suite::test_real()",local_8b,&local_c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_108,0.0);
  local_cb[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_108);
  local_109 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(0.0))","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20f1,"void operator_bool_suite::test_real()",local_cb,&local_109);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_148,1.0);
  local_10b[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_148)
  ;
  local_149 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(1.0))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20f2,"void operator_bool_suite::test_real()",local_10b,&local_149);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_148);
  value_00 = std::numeric_limits<double>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_188,value_00)
  ;
  local_14b[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_188)
  ;
  local_189 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(std::numeric_limits<double>::max()))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20f3,"void operator_bool_suite::test_real()",local_14b,&local_189);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_188);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_1c8,(longdouble)0);
  local_18b[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_1c8)
  ;
  local_1c9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(0.0L))","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20f6,"void operator_bool_suite::test_real()",local_18b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_208,(longdouble)1);
  local_1cb[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_208)
  ;
  local_209 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(1.0L))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20f7,"void operator_bool_suite::test_real()",local_1cb,&local_209);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  std::numeric_limits<long_double>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_248,in_ST0);
  local_20b[0] = trial::dynamic::basic_variable::operator_cast_to_bool((basic_variable *)&local_248)
  ;
  local_249 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("bool(variable(std::numeric_limits<long double>::max()))","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x20f8,"void operator_bool_suite::test_real()",local_20b,&local_249);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_248);
  return;
}

Assistant:

void test_real()
{
    {
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(0.0f)), false);
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(1.0f)), true);
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(std::numeric_limits<float>::max())), true);
    }
    {
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(0.0)), false);
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(1.0)), true);
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(std::numeric_limits<double>::max())), true);
    }
    {
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(0.0L)), false);
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(1.0L)), true);
        TRIAL_PROTOCOL_TEST_EQUAL(bool(variable(std::numeric_limits<long double>::max())), true);
    }
}